

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

interval_t duckdb::Interval::GetDifference(timestamp_t timestamp_1,timestamp_t timestamp_2)

{
  bool bVar1;
  InvalidInputException *this;
  ConversionException *this_00;
  interval_t iVar2;
  allocator local_41;
  int64_t delta_us;
  string local_38;
  
  if ((((timestamp_1.value != -0x7fffffffffffffff) && (timestamp_1.value != 0x7fffffffffffffff)) &&
      (timestamp_2.value != 0x7fffffffffffffff)) && (timestamp_2.value != -0x7fffffffffffffff)) {
    bVar1 = TrySubtractOperator::Operation<long,long,long>
                      (timestamp_1.value,timestamp_2.value,&delta_us);
    if (bVar1) {
      iVar2.micros = delta_us % 86400000000;
      iVar2._0_8_ = delta_us / 86400000000 << 0x20;
      return iVar2;
    }
    this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Timestamp difference is out of bounds",&local_41);
    ConversionException::ConversionException(this_00,&local_38);
    __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Cannot subtract infinite timestamps",(allocator *)&delta_us);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

interval_t Interval::GetDifference(timestamp_t timestamp_1, timestamp_t timestamp_2) {
	if (!Timestamp::IsFinite(timestamp_1) || !Timestamp::IsFinite(timestamp_2)) {
		throw InvalidInputException("Cannot subtract infinite timestamps");
	}
	const auto us_1 = Timestamp::GetEpochMicroSeconds(timestamp_1);
	const auto us_2 = Timestamp::GetEpochMicroSeconds(timestamp_2);
	int64_t delta_us;
	if (!TrySubtractOperator::Operation(us_1, us_2, delta_us)) {
		throw ConversionException("Timestamp difference is out of bounds");
	}
	return FromMicro(delta_us);
}